

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O2

bool rcg::setEnum(shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,char *value,bool exception
                 )

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  long *plVar4;
  undefined8 uVar5;
  invalid_argument *piVar6;
  allocator local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  peVar1 = (nodemap->super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  GenICam_3_4::gcstring::gcstring((gcstring *)local_c0,name);
  iVar2 = (*(peVar1->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
            super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar1,local_c0);
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  GenICam_3_4::gcstring::~gcstring((gcstring *)local_c0);
  if (plVar3 == (long *)0x0) {
    if (exception) {
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)&local_e0,"Feature not found: ",(allocator *)&local_70)
      ;
      std::operator+(local_c0,&local_e0,name);
      std::invalid_argument::invalid_argument(piVar6,(string *)local_c0);
      __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  else {
    iVar2 = (*(code *)**(undefined8 **)((long)plVar3 + *(long *)(*plVar3 + -0x28)))
                      ((long)plVar3 + *(long *)(*plVar3 + -0x28));
    if ((iVar2 == 4) || (iVar2 == 2)) {
      plVar3 = (long *)__dynamic_cast(plVar3,&GenApi_3_4::INode::typeinfo,
                                      &GenApi_3_4::IEnumeration::typeinfo,0xfffffffffffffffe);
      if (plVar3 == (long *)0x0) {
        if (exception) {
          piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string
                    ((string *)&local_e0,"Feature not enumeration: ",(allocator *)&local_70);
          std::operator+(local_c0,&local_e0,name);
          std::invalid_argument::invalid_argument(piVar6,(string *)local_c0);
          __cxa_throw(piVar6,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
      else {
        GenICam_3_4::gcstring::gcstring((gcstring *)local_c0,value);
        plVar4 = (long *)(**(code **)(*plVar3 + 0x68))(plVar3,local_c0);
        GenICam_3_4::gcstring::~gcstring((gcstring *)local_c0);
        if (plVar4 != (long *)0x0) {
          uVar5 = (**(code **)(*plVar4 + 0x38))(plVar4);
          (**(code **)(*plVar3 + 0x50))(plVar3,uVar5,1);
          return true;
        }
        if (exception) {
          piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string((string *)&local_50,"Enumeration \'",&local_e1);
          std::operator+(&local_70,&local_50,name);
          std::operator+(&local_e0,&local_70,"\' does not contain: ");
          std::operator+(local_c0,&local_e0,value);
          std::invalid_argument::invalid_argument(piVar6,(string *)local_c0);
          __cxa_throw(piVar6,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
      }
    }
    else if (exception) {
      piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_e0,"Feature not writable: ",(allocator *)&local_70);
      std::operator+(local_c0,&local_e0,name);
      std::invalid_argument::invalid_argument(piVar6,(string *)local_c0);
      __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  return false;
}

Assistant:

bool setEnum(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
             const char *value, bool exception)
{
  bool ret=false;

  try
  {
    GenApi::INode *node=nodemap->_GetNode(name);

    if (node != 0)
    {
      if (GenApi::IsWritable(node))
      {
        GenApi::IEnumeration *val=dynamic_cast<GenApi::IEnumeration *>(node);

        if (val != 0)
        {
          GenApi::IEnumEntry *entry=0;

          try
          {
            entry=val->GetEntryByName(value);
          }
          catch (const GENICAM_NAMESPACE::GenericException &)
          { }

          if (entry != 0)
          {
            val->SetIntValue(entry->GetValue());

            return true;
          }
          else if (exception)
          {
            throw std::invalid_argument(std::string("Enumeration '")+name+
                                        "' does not contain: "+value);
          }
        }
        else if (exception)
        {
          throw std::invalid_argument(std::string("Feature not enumeration: ")+name);
        }
      }
      else if (exception)
      {
        throw std::invalid_argument(std::string("Feature not writable: ")+name);
      }
    }
    else if (exception)
    {
      throw std::invalid_argument(std::string("Feature not found: ")+name);
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return ret;
}